

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawPartialWarpedDecal
          (PixelGameEngine *this,Decal *decal,vf2d *pos,vf2d *source_pos,vf2d *source_size,
          Pixel *tint)

{
  undefined1 auVar1 [16];
  v2d_generic<float> vVar2;
  undefined1 auVar3 [16];
  int i;
  undefined4 extraout_EAX;
  int iVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float d [4];
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [32];
  pointer pvStack_80;
  pointer local_78;
  pointer pvStack_70;
  pointer local_68;
  pointer pfStack_60;
  pointer local_58;
  pointer pPStack_50;
  pointer local_48;
  pointer pPStack_40;
  DecalMode local_38;
  uint32_t uStack_34;
  
  local_48 = (pointer)0x0;
  pPStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pPStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pfStack_60 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pvStack_70 = (pointer)0x0;
  local_a0._24_8_ = (pointer)0x0;
  pvStack_80 = (pointer)0x0;
  local_a0._8_8_ = (pointer)0x0;
  local_a0._16_8_ = (pointer)0x0;
  local_38 = NORMAL;
  uStack_34 = 4;
  local_c8._4_4_ = (tint->field_0).n;
  local_c8._0_4_ = local_c8._4_4_;
  uStack_c0._0_4_ = local_c8._4_4_;
  uStack_c0._4_4_ = (float)local_c8._4_4_;
  local_a0._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&pPStack_50,local_c8);
  local_c8 = (undefined1  [8])0x3f8000003f800000;
  uStack_c0 = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&local_68,local_c8);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_a0 + 8),4);
  _local_c8 = ZEXT816(0x3f80000000000000) << 0x40;
  local_b8 = 0x3f8000003f800000;
  uStack_b0 = 0x3f800000;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&pvStack_80,
             local_c8);
  fVar7 = (pos[3].y - pos[1].y) * (pos[2].x - pos->x) - (pos[2].y - pos->y) * (pos[3].x - pos[1].x);
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar8 = (decal->vUVScale).x;
    local_c8._0_4_ = (*source_pos).x * fVar8;
    fVar9 = (decal->vUVScale).y;
    local_c8._4_4_ = (*source_pos).y * fVar9;
    fVar8 = (*source_size).x * fVar8 + (float)local_c8._0_4_;
    uStack_c0._4_4_ = (*source_size).y * fVar9 + (float)local_c8._4_4_;
    uStack_c0._0_4_ = local_c8._0_4_;
    local_b8 = CONCAT44(uStack_c0._4_4_,fVar8);
    uStack_b0 = CONCAT44(local_c8._4_4_,fVar8);
    std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
    _M_assign_aux<olc::v2d_generic<float>const*>
              ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)
               &pvStack_80,local_c8);
    fVar8 = pos->x;
    fVar9 = pos->y;
    fVar13 = fVar9 - pos[1].y;
    fVar14 = fVar8 - pos[1].x;
    fVar10 = pos[2].x - fVar8;
    fVar12 = pos[2].y - fVar9;
    fVar11 = (1.0 / fVar7) * (fVar13 * (pos[3].x - pos[1].x) - fVar14 * (pos[3].y - pos[1].y));
    fVar7 = (1.0 / fVar7) * (fVar13 * fVar10 - fVar14 * fVar12);
    auVar3._4_4_ = -(uint)(1.0 < fVar7);
    auVar3._0_4_ = -(uint)(1.0 < fVar11);
    auVar3._8_4_ = -(uint)(fVar11 < 0.0);
    auVar3._12_4_ = -(uint)(fVar7 < 0.0);
    iVar4 = movmskps(extraout_EAX,auVar3);
    fVar7 = 0.0;
    if (iVar4 == 0) {
      fVar9 = fVar9 + fVar12 * fVar11;
      fVar7 = fVar8 + fVar10 * fVar11;
    }
    else {
      fVar9 = 0.0;
    }
    auVar6._4_4_ = fVar9;
    auVar6._0_4_ = fVar9;
    auVar6._8_4_ = fVar9;
    auVar6._12_4_ = fVar9;
    fVar12 = pos->x - fVar7;
    fVar13 = pos[1].x - fVar7;
    fVar14 = pos[2].x - fVar7;
    fVar7 = pos[3].x - fVar7;
    fVar8 = pos->y - fVar9;
    fVar10 = pos[1].y - fVar9;
    fVar11 = pos[2].y - fVar9;
    fVar9 = pos[3].y - fVar9;
    auVar1._4_4_ = fVar13 * fVar13 + fVar10 * fVar10;
    auVar1._0_4_ = fVar12 * fVar12 + fVar8 * fVar8;
    auVar1._8_4_ = fVar14 * fVar14 + fVar11 * fVar11;
    auVar1._12_4_ = fVar7 * fVar7 + fVar9 * fVar9;
    _local_c8 = sqrtps(auVar6,auVar1);
    uVar5 = 0;
    do {
      fVar7 = *(float *)(local_c8 + uVar5 * 4);
      if ((fVar7 != 0.0) || (fVar8 = 1.0, NAN(fVar7))) {
        fVar8 = (fVar7 + *(float *)(local_c8 + (uVar5 ^ 2) * 4)) /
                *(float *)(local_c8 + (uVar5 ^ 2) * 4);
      }
      vVar2.y = fVar8 * pvStack_80[uVar5].y;
      vVar2.x = fVar8 * pvStack_80[uVar5].x;
      pvStack_80[uVar5] = vVar2;
      local_68[uVar5] = fVar8 * local_68[uVar5];
      fVar7 = pos[uVar5].x * (this->vInvScreenSize).x;
      fVar8 = pos[uVar5].y * (this->vInvScreenSize).y;
      ((pointer)(local_a0._8_8_ + uVar5 * 8))->x = fVar7 + fVar7 + -1.0;
      ((pointer)(local_a0._8_8_ + uVar5 * 8))->y = -(fVar8 + fVar8 + -1.0);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    local_38 = this->nDecalMode;
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
               (value_type *)local_a0);
  }
  if (pPStack_50 != (pointer)0x0) {
    operator_delete(pPStack_50,(long)pPStack_40 - (long)pPStack_50);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (pvStack_80 != (pointer)0x0) {
    operator_delete(pvStack_80,(long)pvStack_70 - (long)pvStack_80);
  }
  if ((pointer)local_a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._8_8_,local_a0._24_8_ - local_a0._8_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawPartialWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			olc::vf2d uvtl = source_pos * decal->vUVScale;
			olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
			di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};

			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}